

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  float fVar1;
  ImVec2 pos_00;
  bool bVar2;
  int iVar3;
  float fVar4;
  float _x;
  float fVar5;
  ImRect total_bb;
  ImRect value_bb;
  ImVec2 pos;
  ImVec2 label_size;
  ImVec2 value_size;
  char *value_text_end;
  char *value_text_begin;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffee8;
  __va_list_tag *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  ImGuiItemFlags extra_flags;
  ImRect *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  ImRect *bb;
  undefined4 in_stack_ffffffffffffff20;
  char *text_end;
  undefined1 hide_text_after_hash;
  undefined4 uVar6;
  undefined4 uVar7;
  ImVec2 *this;
  float in_stack_ffffffffffffff40;
  float fVar8;
  ImVec2 local_b8;
  ImVec2 in_stack_ffffffffffffff50;
  ImRect local_a0;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  char *local_48;
  char *local_40;
  float local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = CalcItemWidth();
    text_end = local_28->TempBuffer;
    local_40 = text_end;
    iVar3 = ImFormatStringV((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    extra_flags = (ImGuiItemFlags)(in_stack_ffffffffffffff00 >> 0x20);
    local_48 = text_end + iVar3;
    uVar6 = 0;
    uVar7 = 0xbf800000;
    local_50 = CalcTextSize(in_stack_ffffffffffffff18,
                            (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0),
                            SUB84(in_stack_ffffffffffffff08,0));
    local_58 = CalcTextSize(in_stack_ffffffffffffff18,
                            (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0),
                            SUB84(in_stack_ffffffffffffff08,0));
    local_60 = (local_20->DC).CursorPos;
    fVar4 = (local_30->FramePadding).y;
    this = &local_80;
    ImVec2::ImVec2(this,local_34,fVar4 + fVar4 + local_50.y);
    local_78 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x194f17);
    ImRect::ImRect(&local_70,&local_60,&local_78);
    if (local_58.x <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (local_30->ItemInnerSpacing).x + local_58.x;
    }
    _x = local_34 + fVar4;
    fVar8 = local_34;
    fVar5 = ImMax<float>(local_50.y,local_58.y);
    fVar1 = (local_30->FramePadding).y;
    bb = &local_a0;
    ImVec2::ImVec2(&bb->Min,_x,fVar1 + fVar1 + fVar5);
    local_a0.Max = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x194ff2);
    ImRect::ImRect(&local_90,&local_60,&local_a0.Max);
    ItemSize((ImRect *)in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    bVar2 = ItemAdd(bb,(ImGuiID)_x,in_stack_ffffffffffffff08,extra_flags);
    if (bVar2) {
      operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x195069);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,0.0,0.0);
      RenderTextClipped((ImVec2 *)CONCAT44(fVar8,in_stack_ffffffffffffff40),this,
                        (char *)CONCAT44(uVar7,uVar6),text_end,
                        (ImVec2 *)CONCAT44(fVar4,in_stack_ffffffffffffff20),&bb->Min,
                        (ImRect *)in_stack_ffffffffffffff50);
      hide_text_after_hash = (undefined1)((ulong)text_end >> 0x38);
      if (0.0 < local_58.x) {
        ImVec2::ImVec2(&local_b8,local_70.Max.x + (local_30->ItemInnerSpacing).x,
                       local_70.Min.y + (local_30->FramePadding).y);
        pos_00.y = fVar8;
        pos_00.x = in_stack_ffffffffffffff40;
        RenderText(pos_00,(char *)this,(char *)CONCAT44(uVar7,uVar6),(bool)hide_text_after_hash);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const char* value_text_begin = &g.TempBuffer[0];
    const char* value_text_end = value_text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 value_size = CalcTextSize(value_text_begin, value_text_end, false);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImVec2 pos = window->DC.CursorPos;
    const ImRect value_bb(pos, pos + ImVec2(w, value_size.y + style.FramePadding.y * 2));
    const ImRect total_bb(pos, pos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), ImMax(value_size.y, label_size.y) + style.FramePadding.y * 2));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    RenderTextClipped(value_bb.Min + style.FramePadding, value_bb.Max, value_text_begin, value_text_end, &value_size, ImVec2(0.0f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}